

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

bool __thiscall
duckdb::Bit::TryGetBitStringSize(Bit *this,string_t str,idx_t *str_len,string *error_message)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  ulong *puVar2;
  byte *pbVar3;
  bool bVar4;
  string error;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined8 local_30;
  byte *local_28;
  
  puVar2 = str.value._8_8_;
  local_28 = str.value._0_8_;
  pbVar3 = str.value._0_8_;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pbVar3 = (byte *)((long)&local_30 + 4);
  }
  *puVar2 = 0;
  local_30 = this;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      ((ulong)this & 0xffffffff) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
    do {
      if ((*pbVar3 & 0xfe) != 0x30) {
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,
                   "Invalid character encountered in string -> bit conversion: \'%s\'","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pbVar3,pbVar3 + 1);
        StringUtil::Format<std::__cxx11::string>(&local_90,(StringUtil *)local_50,&local_70,params);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        HandleCastError::AssignError(&local_90,(string *)str_len,(optional_idx)0xffffffffffffffff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00db77cc;
        goto LAB_00db77c7;
      }
      *puVar2 = (ulong)params;
      pbVar3 = pbVar3 + 1;
      bVar4 = params != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((ulong)this & 0xffffffff);
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(params->_M_dataplus)._M_p + 1);
    } while (bVar4);
  }
  uVar1 = *puVar2;
  if (uVar1 == 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Cannot cast empty string to BIT","");
    HandleCastError::AssignError(&local_90,(string *)str_len,(optional_idx)0xffffffffffffffff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_00db77c7:
      operator_delete(local_90._M_dataplus._M_p);
    }
LAB_00db77cc:
    bVar4 = false;
  }
  else {
    *puVar2 = ((uVar1 >> 3) - (ulong)((uVar1 & 7) == 0)) + 2;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool Bit::TryGetBitStringSize(string_t str, idx_t &str_len, string *error_message) {
	auto data = const_data_ptr_cast(str.GetData());
	auto len = str.GetSize();
	str_len = 0;
	for (idx_t i = 0; i < len; i++) {
		if (data[i] == '0' || data[i] == '1') {
			str_len++;
		} else {
			string error = StringUtil::Format("Invalid character encountered in string -> bit conversion: '%s'",
			                                  string(const_char_ptr_cast(data) + i, 1));
			HandleCastError::AssignError(error, error_message);
			return false;
		}
	}
	if (str_len == 0) {
		string error = "Cannot cast empty string to BIT";
		HandleCastError::AssignError(error, error_message);
		return false;
	}
	str_len = ComputeBitstringLen(str_len);
	return true;
}